

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O0

bool __thiscall r_exec::StructureValue::contains(StructureValue *this,Atom *s)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  Code *pCVar5;
  undefined4 extraout_var;
  ulong uVar6;
  undefined4 extraout_var_00;
  ulong uVar7;
  undefined4 extraout_var_01;
  float fVar8;
  float fVar9;
  int local_40;
  undefined4 local_2c;
  undefined4 local_28;
  Atom _a;
  ushort local_22;
  Atom a;
  uint16_t i;
  Atom *s_local;
  StructureValue *this_local;
  
  pCVar5 = core::P<r_code::Code>::operator->(&this->structure);
  iVar3 = (*(pCVar5->super__Object)._vptr__Object[4])(pCVar5,0);
  uVar6 = r_code::Atom::operator!=((Atom *)CONCAT44(extraout_var,iVar3),s);
  if ((uVar6 & 1) == 0) {
    pCVar5 = core::P<r_code::Code>::operator->(&this->structure);
    (*(pCVar5->super__Object)._vptr__Object[4])(pCVar5,0);
    cVar1 = r_code::Atom::getDescriptor();
    if (cVar1 == -0x39) {
      pCVar5 = core::P<r_code::Code>::operator->(&this->structure);
      iVar3 = (*(pCVar5->super__Object)._vptr__Object[4])(pCVar5,0);
      uVar6 = r_code::Utils::GetTimestamp((Atom *)CONCAT44(extraout_var_00,iVar3));
      uVar7 = r_code::Utils::GetTimestamp(s);
      bVar2 = r_code::Utils::Synchronous(uVar6,uVar7);
      this_local._7_1_ = bVar2 & 1;
    }
    else {
      local_22 = 1;
      while( true ) {
        pCVar5 = core::P<r_code::Code>::operator->(&this->structure);
        uVar4 = (*(pCVar5->super__Object)._vptr__Object[6])();
        if ((uVar4 & 0xffff) <= (uint)local_22) break;
        pCVar5 = core::P<r_code::Code>::operator->(&this->structure);
        iVar3 = (*(pCVar5->super__Object)._vptr__Object[4])(pCVar5,(ulong)local_22);
        local_28 = *(undefined4 *)CONCAT44(extraout_var_01,iVar3);
        local_2c = *(undefined4 *)(s + (ulong)local_22 * 4);
        bVar2 = r_code::Atom::operator==((Atom *)&local_28,(Atom *)&local_2c);
        if ((bVar2 & 1) == 0) {
          bVar2 = r_code::Atom::isFloat();
          if (((bVar2 & 1) == 0) || (bVar2 = r_code::Atom::isFloat(), (bVar2 & 1) == 0)) {
            this_local._7_1_ = 0;
            local_40 = 1;
          }
          else {
            fVar8 = (float)r_code::Atom::asFloat();
            fVar9 = (float)r_code::Atom::asFloat();
            bVar2 = r_code::Utils::Equal((double)fVar8,(double)fVar9);
            this_local._7_1_ = bVar2 & 1;
            local_40 = 1;
          }
        }
        else {
          local_40 = 4;
        }
        r_code::Atom::~Atom((Atom *)&local_2c);
        r_code::Atom::~Atom((Atom *)&local_28);
        if (local_40 == 1) goto LAB_00204743;
        local_22 = local_22 + 1;
      }
      this_local._7_1_ = 1;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00204743:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StructureValue::contains(const Atom *s) const
{
    if (structure->code(0) != s[0]) {
        return false;
    }

    if (structure->code(0).getDescriptor() == Atom::TIMESTAMP) {
        return Utils::Synchronous(Utils::GetTimestamp(&structure->code(0)), Utils::GetTimestamp(s));
    }

    for (uint16_t i = 1; i < structure->code_size(); ++i) {
        Atom a = structure->code(i);
        Atom _a = s[i];

        if (a == _a) {
            continue;
        }

        if (a.isFloat() && _a.isFloat()) {
            return Utils::Equal(a.asFloat(), _a.asFloat());
        }

        return false;
    }

    return true;
}